

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_2,_false>,_-1,_1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false>,__1,_1,_true,_true>
                  *this,Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false> *xpr,Index i)

{
  ScalarWithConstIfNotLvalue *ptr;
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false> *nbCols;
  PointerType in_RDX;
  EVP_PKEY_CTX *in_RSI;
  BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false>,__1,_1,_true,_true>
  *in_RDI;
  Index unaff_retaddr;
  Index in_stack_00000008;
  
  ptr = MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_2,_false>,_1>::coeffRef
                  ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false>,_1> *)i
                   ,in_stack_00000008,unaff_retaddr);
  nbCols = (Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false> *)const_cast_ptr<double>(ptr);
  MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_2,_false>,_0>::rows
            ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false>,_0> *)
             0x304346);
  MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_2,_false>,_-1,_1,_true>,_1>
  ::MapBase((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false>,__1,_1,_true>,_1>
             *)in_RSI,in_RDX,(Index)in_RDI,(Index)nbCols);
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_2,_false>::Block
            ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_2,_false> *)in_RDI,nbCols);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

inline BlockImpl_dense(XprType& xpr, Index i)
      : Base(internal::const_cast_ptr(&xpr.coeffRef(
              (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0,
              (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr)
    {
      init();
    }